

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O2

int lib::math::Modf(State *state)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double ipart;
  StackAPI api;
  
  luna::StackAPI::StackAPI(&api,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&api,1,ValueT_Number);
  iVar2 = 0;
  if (bVar1) {
    ipart = 0.0;
    dVar3 = luna::StackAPI::GetNumber(&api,0);
    dVar3 = modf(dVar3,&ipart);
    luna::StackAPI::PushNumber(&api,ipart);
    luna::StackAPI::PushNumber(&api,dVar3);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int Modf(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Number))
            return 0;

        double ipart = 0.0;
        auto fpart = std::modf(api.GetNumber(0), &ipart);
        api.PushNumber(ipart);
        api.PushNumber(fpart);
        return 2;
    }